

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O3

void up_heap(priority_queue *qp,size_t i)

{
  ulong uVar1;
  priority_queue_element *ppVar2;
  anon_union_8_2_94730108_for_payload aVar3;
  wchar_t wVar4;
  undefined4 uVar5;
  wchar_t wVar6;
  undefined4 uVar7;
  ulong uVar8;
  priority_queue_element *ppVar9;
  priority_queue_element tmp;
  
  if (i != 0) {
    do {
      uVar1 = i - 1;
      uVar8 = uVar1 >> 1;
      ppVar2 = qp->data;
      if (ppVar2[uVar8].priority <= ppVar2[i].priority) {
        return;
      }
      ppVar9 = ppVar2 + uVar8;
      aVar3 = ppVar9->payload;
      wVar6 = ppVar9->priority;
      uVar7 = *(undefined4 *)&ppVar9->field_0xc;
      ppVar2 = ppVar2 + i;
      wVar4 = ppVar2->priority;
      uVar5 = *(undefined4 *)&ppVar2->field_0xc;
      ppVar9->payload = ppVar2->payload;
      ppVar9->priority = wVar4;
      *(undefined4 *)&ppVar9->field_0xc = uVar5;
      ppVar2 = qp->data + i;
      ppVar2->payload = aVar3;
      ppVar2->priority = wVar6;
      *(undefined4 *)&ppVar2->field_0xc = uVar7;
      i = uVar8;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

static void up_heap(struct priority_queue *qp, size_t i)
{
	while (1) {
		size_t parent;
		struct priority_queue_element tmp;

		if (i == 0) {
			break;
		}
		parent = (i - 1) >> 1;
		if (qp->data[i].priority >= qp->data[parent].priority) {
			break;
		}
		tmp = qp->data[parent];
		qp->data[parent] = qp->data[i];
		qp->data[i] = tmp;
		i = parent;
	}
}